

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::ZipDatabase::ZipDatabase(ZipDatabase *this,string *path_,DatabaseMode mode_)

{
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *local_28;
  DatabaseMode mode__local;
  string *path__local;
  ZipDatabase *this_local;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_00204be8
  ;
  std::__cxx11::string::string((string *)&this->path,(string *)path_);
  local_28 = this->seen_blobs;
  do {
    std::
    unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
    ::unordered_map(local_28);
    local_28 = local_28 + 1;
  } while (local_28 !=
           (unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
            *)&this->mode);
  this->mode = mode_;
  this->alive = false;
  if (this->mode == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  mz_zip_zero_struct(&this->mz);
  return;
}

Assistant:

ZipDatabase(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
		mz_zip_zero_struct(&mz);
	}